

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglcompositor.cpp
# Opt level: O3

QOpenGLCompositor * __thiscall QOpenGLCompositor::grab(QOpenGLCompositor *this)

{
  QOpenGLCompositor *in_RSI;
  long in_FS_OFFSET;
  QSize local_40;
  QOpenGLFramebufferObject local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._vptr_QOpenGLFramebufferObject = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d_ptr.d = (QOpenGLFramebufferObjectPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_40.wd.m_i =
       ((in_RSI->m_nativeTargetGeometry).x2.m_i - (in_RSI->m_nativeTargetGeometry).x1.m_i) + 1;
  local_40.ht.m_i =
       ((in_RSI->m_nativeTargetGeometry).y2.m_i - (in_RSI->m_nativeTargetGeometry).y1.m_i) + 1;
  QOpenGLFramebufferObject::QOpenGLFramebufferObject(&local_38,&local_40,0xde1);
  grabToFrameBufferObject(in_RSI,&local_38,Flipped);
  QOpenGLFramebufferObject::toImage((QOpenGLFramebufferObject *)this,SUB81(&local_38,0));
  QOpenGLFramebufferObject::~QOpenGLFramebufferObject(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QImage QOpenGLCompositor::grab()
{
    Q_ASSERT(m_context && m_targetWindow);
    QOpenGLFramebufferObject fbo(m_nativeTargetGeometry.size());
    grabToFrameBufferObject(&fbo);
    return fbo.toImage();
}